

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

int __thiscall
cs_impl::any::holder<std::_Ios_Openmode>::kill
          (holder<std::_Ios_Openmode> *this,__pid_t __pid,int __sig)

{
  undefined8 *puVar1;
  int extraout_EAX;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  (**(this->super_baseHolder)._vptr_baseHolder)
            (this,CONCAT44(in_register_00000034,__pid),CONCAT44(in_register_00000014,__sig));
  if ((_DAT_00262d00 < 0x40) && (cs::global_thread_counter == 0)) {
    puVar1 = &allocator + _DAT_00262d00;
    _DAT_00262d00 = _DAT_00262d00 + 1;
    *puVar1 = this;
    return 0x262af8;
  }
  operator_delete(this,0x10);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}